

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  undefined1 local_1f0 [8];
  string makefileName_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string makefileName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string makefileName;
  undefined1 local_c0 [8];
  string generator;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  byte local_31;
  string *local_30;
  string *target_local;
  string *makefile_local;
  string *make_local;
  cmExtraSublimeTextGenerator *this_local;
  string *command;
  
  local_31 = 0;
  local_30 = target;
  target_local = makefile;
  makefile_local = make;
  make_local = (string *)this;
  this_local = (cmExtraSublimeTextGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_68,'\"');
  cmAlphaNum::cmAlphaNum(&local_98,makefile_local);
  generator.field_2._M_local_buf[0xf] = '\"';
  cmStrCat<char>(__return_storage_ptr__,&local_68,&local_98,generator.field_2._M_local_buf + 0xf);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_c0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c0,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath((string *)local_f0,target_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"/NOLOGO\", \"/f\", \"");
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),", \"",local_30);
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)(makefileName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath((string *)local_170,target_local);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),", \"",local_30);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)(makefileName_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_170);
    }
    else {
      std::__cxx11::string::string((string *)local_1f0);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_1f0,(string *)target_local);
      }
      else {
        cmSystemTools::ConvertToOutputPath(&local_210,target_local);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
        std::__cxx11::string::~string((string *)&local_210);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::operator+(&local_270,", \"",local_30);
      std::operator+(&local_250,&local_270,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)local_1f0);
    }
  }
  local_31 = 1;
  std::__cxx11::string::~string((string *)local_c0);
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}